

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O2

QString * QStyleHelper::uniqueName
                    (QString *__return_storage_ptr__,QString *key,QStyleOption *option,QSize *size,
                    qreal dpr)

{
  QWidget *this;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  QStyleOptionComplex *pQVar5;
  QStyleOptionSpinBox *pQVar6;
  Int IVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<double>_>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QWidget *)option->styleObject;
  if (((this == (QWidget *)0x0) || ((*(byte *)(*(long *)&this->field_0x8 + 0x30) & 1) == 0)) ||
     (bVar4 = QWidget::testAttribute_helper(this,WA_StyleSheetTarget), !bVar4)) {
    pQVar5 = qstyleoption_cast<QStyleOptionComplex_const*>(option);
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a.a.a.a.a.b.val =
         (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i;
    local_78.a.a.a.a.a.b.val = option->direction;
    if (pQVar5 == (QStyleOptionComplex *)0x0) {
      IVar7 = 0;
    }
    else {
      IVar7 = (pQVar5->activeSubControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
              super_QFlagsStorage<QStyle::SubControl>.i;
    }
    local_78.a.a.a.b.val = QPalette::cacheKey();
    local_78.a.a.b.val = (size->wd).m_i;
    local_78.a.b.val = (size->ht).m_i;
    local_78.a.a.a.a.a.a.a = key;
    local_78.a.a.a.a.b.val = IVar7;
    local_78.b.val = dpr;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<double>_>
    ::convertTo<QString>(__return_storage_ptr__,&local_78);
    pQVar6 = qstyleoption_cast<QStyleOptionSpinBox_const*>(option);
    if (pQVar6 != (QStyleOptionSpinBox *)0x0) {
      local_78.a.a.a.a.a.a.b.val = pQVar6->buttonSymbols;
      local_78.a.a.a.a.a.b.val =
           (pQVar6->stepEnabled).super_QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4>.
           super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i;
      local_78.a.a.a.a.b.val = CONCAT22(local_78.a.a.a.a.b.val._2_2_,(ushort)pQVar6->frame) | 0x30;
      local_78.a.a.a.a.a.a.a = __return_storage_ptr__;
      QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_QChar>
      ::convertTo<QString>
                ((QString *)&local_98,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_QChar>
                  *)&local_78);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_98.d;
      (__return_storage_ptr__->d).ptr = local_98.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_98.size;
      local_98.d = pDVar2;
      local_98.ptr = pcVar3;
      local_98.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString uniqueName(const QString &key, const QStyleOption *option, const QSize &size, qreal dpr)
{
    if (!usePixmapCache(option))
        return {};

    const QStyleOptionComplex *complexOption = qstyleoption_cast<const QStyleOptionComplex *>(option);
    QString tmp = key % HexString<uint>(option->state)
                      % HexString<uint>(option->direction)
                      % HexString<uint>(complexOption ? uint(complexOption->activeSubControls) : 0u)
                      % HexString<quint64>(option->palette.cacheKey())
                      % HexString<uint>(size.width())
                      % HexString<uint>(size.height())
                      % HexString<qreal>(dpr);

#if QT_CONFIG(spinbox)
    if (const QStyleOptionSpinBox *spinBox = qstyleoption_cast<const QStyleOptionSpinBox *>(option)) {
        tmp = tmp % HexString<uint>(spinBox->buttonSymbols)
                  % HexString<uint>(spinBox->stepEnabled)
                  % QChar(spinBox->frame ? u'1' : u'0');
    }
#endif // QT_CONFIG(spinbox)

    return tmp;
}